

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcProperty::~IfcProperty(IfcProperty *this)

{
  ~IfcProperty((IfcProperty *)
               ((long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                       _vptr_ObjectHelper +
               (long)(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProperty,_2UL>).
                     _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcProperty() : Object("IfcProperty") {}